

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_line<charls::transform_hp1<unsigned_short>::inverse,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,inverse *transform)

{
  ushort uVar1;
  short sVar2;
  long lVar3;
  
  if (pixel_count != 0) {
    lVar3 = 0;
    do {
      uVar1 = *(ushort *)((long)&source->field_1 + lVar3);
      sVar2 = *(short *)((long)&source->field_0 + lVar3);
      *(ushort *)((long)&destination->field_2 + lVar3) =
           *(short *)((long)&source->field_2 + lVar3) + uVar1 ^ 0x8000;
      *(uint *)((long)&destination->field_0 + lVar3) =
           (ushort)(sVar2 + uVar1) ^ 0x8000 | (uint)uVar1 << 0x10;
      lVar3 = lVar3 + 6;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}